

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
cmFileCommand::HandleGlobCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool recurse)

{
  string *val;
  WorkingMode WVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  long lVar4;
  pointer pMVar5;
  bool bVar6;
  bool bVar7;
  PolicyStatus PVar8;
  int iVar9;
  undefined4 uVar10;
  cmake *pcVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  long *plVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined8 extraout_RAX_00;
  char *pcVar14;
  char *__s;
  ulong uVar15;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var16;
  bool bVar17;
  element_type *peVar18;
  size_type *psVar19;
  PolicyID extraout_EDX;
  PolicyID extraout_EDX_00;
  PolicyID extraout_EDX_01;
  PolicyID extraout_EDX_02;
  PolicyID extraout_EDX_03;
  PolicyID extraout_EDX_04;
  PolicyID extraout_EDX_05;
  PolicyID extraout_EDX_06;
  PolicyID id;
  undefined7 in_register_00000011;
  pointer pMVar20;
  pointer pbVar21;
  pointer pMVar22;
  pointer pMVar23;
  pointer pbVar24;
  pointer pbVar25;
  undefined1 auVar26 [12];
  string expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_148;
  undefined4 local_140;
  undefined4 local_13c;
  uint local_138;
  undefined4 local_134;
  cmListFileBacktrace local_130;
  undefined1 local_120 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string variable;
  GlobMessages globMessages;
  Glob g;
  
  pbVar25 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar25) < 0x21) {
    __assert_fail("args.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmFileCommand.cxx"
                  ,0x2f9,
                  "bool cmFileCommand::HandleGlobCommand(const std::vector<std::string> &, bool)");
  }
  variable._M_dataplus._M_p = (pointer)&variable.field_2;
  pcVar2 = pbVar25[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&variable,pcVar2,pcVar2 + pbVar25[1]._M_string_length);
  cmsys::Glob::Glob(&g);
  g.Recurse = recurse;
  PVar8 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0009,false);
  if (PVar8 < (REQUIRED_ALWAYS|WARN) && recurse) {
    g.RecurseThroughSymlinks = SUB81(0x101L >> ((char)PVar8 * '\b' & 0x3fU),0);
  }
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar11 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
  pbVar25 = pbVar25 + 2;
  if (pbVar25 !=
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    WVar1 = pcVar11->CurrentWorkingMode;
    local_134 = (undefined4)CONCAT71(in_register_00000011,recurse);
    local_120._20_4_ = 0;
    local_138 = 0;
    local_13c = 0;
    local_140 = 0;
    local_148 = args;
    do {
      iVar9 = std::__cxx11::string::compare((char *)pbVar25);
      if (iVar9 == 0) {
        val = pbVar25 + 1;
        if (val == (local_148->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish) {
          expr._M_dataplus._M_p = (pointer)&expr.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&expr,"LIST_DIRECTORIES missing bool value.","");
          cmCommand::SetError(&this->super_cmCommand,&expr);
          goto LAB_002acb5b;
        }
        bVar7 = cmSystemTools::IsOn(val);
        bVar17 = true;
        id = extraout_EDX_00;
        if (!bVar7) {
          bVar7 = cmSystemTools::IsOff(val);
          if (!bVar7) {
            expr._M_dataplus._M_p = (pointer)&expr.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&expr,"LIST_DIRECTORIES missing bool value.","");
            cmCommand::SetError(&this->super_cmCommand,&expr);
            goto LAB_002acb5b;
          }
          bVar17 = false;
          id = extraout_EDX_01;
        }
        pbVar25 = pbVar25 + 2;
        g.ListDirs = bVar17;
        g.RecurseListDirs = bVar17;
      }
      else {
        auVar26 = std::__cxx11::string::compare((char *)pbVar25);
        id = auVar26._8_4_;
        if (auVar26._0_4_ != 0) {
          iVar9 = std::__cxx11::string::compare((char *)pbVar25);
          if (iVar9 == 0) {
            if (pbVar25 + 1 ==
                (local_148->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              expr._M_dataplus._M_p = (pointer)&expr.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&expr,"GLOB requires a directory after the RELATIVE tag.","");
              cmCommand::SetError(&this->super_cmCommand,&expr);
            }
            else {
              cmsys::Glob::SetRelative(&g,pbVar25[1]._M_dataplus._M_p);
              pbVar25 = pbVar25 + 2;
              id = extraout_EDX_02;
              if (pbVar25 !=
                  (local_148->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) goto LAB_002ac8e8;
              expr._M_dataplus._M_p = (pointer)&expr.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&expr,"GLOB requires a glob expression after the directory.","");
              cmCommand::SetError(&this->super_cmCommand,&expr);
            }
LAB_002acb5b:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)expr._M_dataplus._M_p != &expr.field_2) {
              operator_delete(expr._M_dataplus._M_p,expr.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            iVar9 = std::__cxx11::string::compare((char *)pbVar25);
            if (iVar9 == 0) {
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(ulong)CONCAT31((int3)((uint)local_13c >> 8),~(byte)local_13c);
              id = extraout_EDX;
              if ((((byte)local_138 | ~(byte)local_13c) & 1) == 0) {
                pcVar3 = (this->super_cmCommand).Makefile;
                expr._M_dataplus._M_p = (pointer)&expr.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&expr,
                           "CONFIGURE_DEPENDS flag was given after a glob expression was already evaluated."
                           ,"");
                cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&expr);
                paVar12 = &expr.field_2;
                id = extraout_EDX_03;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)expr._M_dataplus._M_p != paVar12) {
                  operator_delete(expr._M_dataplus._M_p,expr.field_2._M_allocated_capacity + 1);
                  paVar12 = extraout_RAX;
                  id = extraout_EDX_04;
                }
              }
              if (WVar1 == NORMAL_MODE) {
                pbVar25 = pbVar25 + 1;
                local_138 = (uint)CONCAT71((int7)((ulong)paVar12 >> 8),1);
                if (pbVar25 !=
                    (local_148->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) goto LAB_002ac8e8;
                expr._M_dataplus._M_p = (pointer)&expr.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&expr,
                           "GLOB requires a glob expression after CONFIGURE_DEPENDS.","");
                cmCommand::SetError(&this->super_cmCommand,&expr);
              }
              else {
                pcVar3 = (this->super_cmCommand).Makefile;
                expr._M_dataplus._M_p = (pointer)&expr.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&expr,
                           "CONFIGURE_DEPENDS is invalid for script and find package modes.","");
                cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&expr);
              }
              goto LAB_002acb5b;
            }
            expr._M_dataplus._M_p = (pointer)&expr.field_2;
            pcVar2 = (pbVar25->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&expr,pcVar2,pcVar2 + pbVar25->_M_string_length);
            bVar7 = cmsys::SystemTools::FileIsFullPath(pbVar25);
            if (!bVar7) {
              cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
              std::__cxx11::string::_M_assign((string *)&expr);
              if (expr._M_string_length == 0) {
                std::__cxx11::string::_M_assign((string *)&expr);
              }
              else {
                std::operator+(&local_168,"/",pbVar25);
                std::__cxx11::string::_M_append((char *)&expr,(ulong)local_168._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168._M_dataplus._M_p != &local_168.field_2) {
                  operator_delete(local_168._M_dataplus._M_p,
                                  local_168.field_2._M_allocated_capacity + 1);
                }
              }
            }
            globMessages.
            super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            globMessages.
            super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            globMessages.
            super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            cmsys::Glob::FindFiles(&g,&expr,&globMessages);
            pMVar5 = globMessages.
                     super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (globMessages.
                super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                globMessages.
                super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
LAB_002ac706:
              if (recurse && (local_120._20_4_ & 1) == 0) {
                local_140 = CONCAT31((int3)((uint)local_140 >> 8),
                                     (byte)local_140 | g.FollowedSymlinkCount != 0);
              }
              this_00 = cmsys::Glob::GetFiles_abi_cxx11_(&g);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&files
                         ,files.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                         (this_00->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (this_00->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
              uVar10 = (int)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
              if ((local_138 & 1) != 0) {
                pbVar21 = (this_00->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                pbVar24 = (this_00->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
                if (pbVar21 != pbVar24) {
                  uVar15 = (long)pbVar24 - (long)pbVar21 >> 5;
                  lVar4 = 0x3f;
                  if (uVar15 != 0) {
                    for (; uVar15 >> lVar4 == 0; lVar4 = lVar4 + -1) {
                    }
                  }
                  std::
                  __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                            (pbVar21,pbVar24,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
                  std::
                  __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            (pbVar21,pbVar24);
                  pbVar21 = (this_00->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  pbVar24 = (this_00->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish;
                }
                _Var16 = std::
                         __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                                   (pbVar21,pbVar24);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_erase(this_00,(iterator)_Var16._M_current,
                           (this_00->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
                pcVar11 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
                bVar6 = g.RecurseThroughSymlinks;
                bVar17 = (bool)(byte)local_134;
                bVar7 = (&g.ListDirs)[(byte)local_134];
                pcVar14 = cmsys::Glob::GetRelative(&g);
                __s = "";
                if (pcVar14 != (char *)0x0) {
                  __s = cmsys::Glob::GetRelative(&g);
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_168,__s,(allocator<char> *)&local_e8);
                cmMakefile::GetBacktrace((this->super_cmCommand).Makefile);
                cmake::AddGlobCacheEntry
                          (pcVar11,bVar17,(bool)(bVar7 & 1),(bool)(bVar6 & (byte)local_134),
                           &local_168,&expr,this_00,&variable,&local_130);
                if (local_130.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_130.TopEntry.
                             super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
                uVar10 = local_13c;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168._M_dataplus._M_p != &local_168.field_2) {
                  operator_delete(local_168._M_dataplus._M_p,
                                  local_168.field_2._M_allocated_capacity + 1);
                  uVar10 = local_13c;
                }
              }
              pbVar25 = pbVar25 + 1;
              bVar7 = true;
              local_13c = uVar10;
            }
            else {
              bVar7 = false;
              pMVar23 = globMessages.
                        super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                while( true ) {
                  pMVar22 = pMVar23 + 1;
                  pcVar3 = (this->super_cmCommand).Makefile;
                  if (pMVar23->type != cyclicRecursion) break;
                  std::operator+(&local_e8,"Cyclic recursion detected while globbing for \'",pbVar25
                                );
                  plVar13 = (long *)std::__cxx11::string::append((char *)&local_e8);
                  local_130.TopEntry.
                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)local_120;
                  peVar18 = (element_type *)(plVar13 + 2);
                  if ((element_type *)*plVar13 == peVar18) {
                    local_120._0_8_ = (peVar18->field_0).Bottom.State;
                    local_120._8_8_ = plVar13[3];
                  }
                  else {
                    local_120._0_8_ = (peVar18->field_0).Bottom.State;
                    local_130.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)*plVar13;
                  }
                  local_130.TopEntry.
                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar13[1];
                  *plVar13 = (long)peVar18;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  plVar13 = (long *)std::__cxx11::string::_M_append
                                              ((char *)&local_130,
                                               (ulong)(pMVar23->content)._M_dataplus._M_p);
                  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                  psVar19 = (size_type *)(plVar13 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar13 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar19) {
                    local_168.field_2._M_allocated_capacity = *psVar19;
                    local_168.field_2._8_8_ = plVar13[3];
                  }
                  else {
                    local_168.field_2._M_allocated_capacity = *psVar19;
                    local_168._M_dataplus._M_p = (pointer)*plVar13;
                  }
                  local_168._M_string_length = plVar13[1];
                  *plVar13 = (long)psVar19;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&local_168);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_168._M_dataplus._M_p != &local_168.field_2) {
                    operator_delete(local_168._M_dataplus._M_p,
                                    local_168.field_2._M_allocated_capacity + 1);
                  }
                  if (local_130.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr != (element_type *)local_120) {
                    operator_delete(local_130.TopEntry.
                                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr,(ulong)&(((
                                                  map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                                  *)local_120._0_8_)->_M_t)._M_impl.field_0x1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                    operator_delete(local_e8._M_dataplus._M_p,
                                    local_e8.field_2._M_allocated_capacity + 1);
                  }
                  pMVar20 = pMVar23 + 1;
                  pMVar23 = pMVar22;
                  if (pMVar20 == pMVar5) {
                    if (!bVar7) goto LAB_002ac706;
                    goto LAB_002ac6ff;
                  }
                }
                std::operator+(&local_e8,"Error has occurred while globbing for \'",pbVar25);
                plVar13 = (long *)std::__cxx11::string::append((char *)&local_e8);
                local_130.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)local_120;
                peVar18 = (element_type *)(plVar13 + 2);
                if ((element_type *)*plVar13 == peVar18) {
                  local_120._0_8_ = (peVar18->field_0).Bottom.State;
                  local_120._8_8_ = plVar13[3];
                }
                else {
                  local_120._0_8_ = (peVar18->field_0).Bottom.State;
                  local_130.TopEntry.
                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)*plVar13;
                }
                local_130.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar13[1];
                *plVar13 = (long)peVar18;
                plVar13[1] = 0;
                *(undefined1 *)(plVar13 + 2) = 0;
                plVar13 = (long *)std::__cxx11::string::_M_append
                                            ((char *)&local_130,
                                             (ulong)(pMVar23->content)._M_dataplus._M_p);
                local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                psVar19 = (size_type *)(plVar13 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar13 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar19) {
                  local_168.field_2._M_allocated_capacity = *psVar19;
                  local_168.field_2._8_8_ = plVar13[3];
                }
                else {
                  local_168.field_2._M_allocated_capacity = *psVar19;
                  local_168._M_dataplus._M_p = (pointer)*plVar13;
                }
                local_168._M_string_length = plVar13[1];
                *plVar13 = (long)psVar19;
                plVar13[1] = 0;
                *(undefined1 *)(plVar13 + 2) = 0;
                cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_168);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168._M_dataplus._M_p != &local_168.field_2) {
                  operator_delete(local_168._M_dataplus._M_p,
                                  local_168.field_2._M_allocated_capacity + 1);
                }
                if (local_130.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != (element_type *)local_120) {
                  operator_delete(local_130.TopEntry.
                                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,(ulong)&(((
                                                  map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                                  *)local_120._0_8_)->_M_t)._M_impl.field_0x1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
                bVar7 = true;
                pMVar23 = pMVar22;
              } while (pMVar22 != pMVar5);
LAB_002ac6ff:
              bVar7 = false;
            }
            std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::~vector
                      (&globMessages);
            id = extraout_EDX_05;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)expr._M_dataplus._M_p != &expr.field_2) {
              operator_delete(expr._M_dataplus._M_p,expr.field_2._M_allocated_capacity + 1);
              id = extraout_EDX_06;
            }
            if (bVar7) goto LAB_002ac8e8;
          }
          bVar7 = false;
          goto LAB_002acb78;
        }
        pbVar25 = pbVar25 + 1;
        if ((byte)local_134 != '\0') {
          g.RecurseThroughSymlinks = true;
          local_120._20_4_ = (undefined4)CONCAT71(auVar26._1_7_,1);
          if (pbVar25 ==
              (local_148->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            expr._M_dataplus._M_p = (pointer)&expr.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&expr,
                       "GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS.","");
            cmCommand::SetError(&this->super_cmCommand,&expr);
            goto LAB_002acb5b;
          }
        }
      }
LAB_002ac8e8:
    } while (pbVar25 !=
             (local_148->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
    if ((PVar8 < NEW & (byte)local_140) == 1) {
      pcVar3 = (this->super_cmCommand).Makefile;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&expr,(cmPolicies *)0x9,id);
      cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&expr);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)expr._M_dataplus._M_p != &expr.field_2) {
        operator_delete(expr._M_dataplus._M_p,expr.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pbVar21 = files.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar25 = files.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar15 = (long)files.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)files.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar4 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pbVar25,pbVar21);
  }
  _Var16 = std::
           __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (files.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      files.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&files,(iterator)_Var16._M_current,
             (iterator)
             files.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pcVar3 = (this->super_cmCommand).Makefile;
  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(&expr,&files,";");
  cmMakefile::AddDefinition(pcVar3,&variable,expr._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)expr._M_dataplus._M_p != &expr.field_2) {
    operator_delete(expr._M_dataplus._M_p,expr.field_2._M_allocated_capacity + 1);
  }
  bVar7 = true;
LAB_002acb78:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  cmsys::Glob::~Glob(&g);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)variable._M_dataplus._M_p != &variable.field_2) {
    operator_delete(variable._M_dataplus._M_p,variable.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

bool cmFileCommand::HandleGlobCommand(std::vector<std::string> const& args,
                                      bool recurse)
{
  // File commands has at least one argument
  assert(args.size() > 1);

  std::vector<std::string>::const_iterator i = args.begin();

  i++; // Get rid of subcommand

  std::string variable = *i;
  i++;
  cmsys::Glob g;
  g.SetRecurse(recurse);

  bool explicitFollowSymlinks = false;
  cmPolicies::PolicyStatus status =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0009);
  if (recurse) {
    switch (status) {
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        g.RecurseThroughSymlinksOff();
        break;
      case cmPolicies::OLD:
      case cmPolicies::WARN:
        g.RecurseThroughSymlinksOn();
        break;
    }
  }

  std::vector<std::string> files;
  bool configureDepends = false;
  bool warnConfigureLate = false;
  bool warnFollowedSymlinks = false;
  const cmake::WorkingMode workingMode =
    this->Makefile->GetCMakeInstance()->GetWorkingMode();
  while (i != args.end()) {
    if (*i == "LIST_DIRECTORIES") {
      ++i; // skip LIST_DIRECTORIES
      if (i != args.end()) {
        if (cmSystemTools::IsOn(*i)) {
          g.SetListDirs(true);
          g.SetRecurseListDirs(true);
        } else if (cmSystemTools::IsOff(*i)) {
          g.SetListDirs(false);
          g.SetRecurseListDirs(false);
        } else {
          this->SetError("LIST_DIRECTORIES missing bool value.");
          return false;
        }
        ++i;
      } else {
        this->SetError("LIST_DIRECTORIES missing bool value.");
        return false;
      }
    } else if (*i == "FOLLOW_SYMLINKS") {
      ++i; // skip FOLLOW_SYMLINKS
      if (recurse) {
        explicitFollowSymlinks = true;
        g.RecurseThroughSymlinksOn();
        if (i == args.end()) {
          this->SetError(
            "GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS.");
          return false;
        }
      }
    } else if (*i == "RELATIVE") {
      ++i; // skip RELATIVE
      if (i == args.end()) {
        this->SetError("GLOB requires a directory after the RELATIVE tag.");
        return false;
      }
      g.SetRelative(i->c_str());
      ++i;
      if (i == args.end()) {
        this->SetError("GLOB requires a glob expression after the directory.");
        return false;
      }
    } else if (*i == "CONFIGURE_DEPENDS") {
      // Generated build system depends on glob results
      if (!configureDepends && warnConfigureLate) {
        this->Makefile->IssueMessage(
          MessageType::AUTHOR_WARNING,
          "CONFIGURE_DEPENDS flag was given after a glob expression was "
          "already evaluated.");
      }
      if (workingMode != cmake::NORMAL_MODE) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "CONFIGURE_DEPENDS is invalid for script and find package modes.");
        return false;
      }
      configureDepends = true;
      ++i;
      if (i == args.end()) {
        this->SetError(
          "GLOB requires a glob expression after CONFIGURE_DEPENDS.");
        return false;
      }
    } else {
      std::string expr = *i;
      if (!cmsys::SystemTools::FileIsFullPath(*i)) {
        expr = this->Makefile->GetCurrentSourceDirectory();
        // Handle script mode
        if (!expr.empty()) {
          expr += "/" + *i;
        } else {
          expr = *i;
        }
      }

      cmsys::Glob::GlobMessages globMessages;
      g.FindFiles(expr, &globMessages);

      if (!globMessages.empty()) {
        bool shouldExit = false;
        for (cmsys::Glob::Message const& globMessage : globMessages) {
          if (globMessage.type == cmsys::Glob::cyclicRecursion) {
            this->Makefile->IssueMessage(
              MessageType::AUTHOR_WARNING,
              "Cyclic recursion detected while globbing for '" + *i + "':\n" +
                globMessage.content);
          } else {
            this->Makefile->IssueMessage(
              MessageType::FATAL_ERROR,
              "Error has occurred while globbing for '" + *i + "' - " +
                globMessage.content);
            shouldExit = true;
          }
        }
        if (shouldExit) {
          return false;
        }
      }

      if (recurse && !explicitFollowSymlinks &&
          g.GetFollowedSymlinkCount() != 0) {
        warnFollowedSymlinks = true;
      }

      std::vector<std::string>& foundFiles = g.GetFiles();
      cmAppend(files, foundFiles);

      if (configureDepends) {
        std::sort(foundFiles.begin(), foundFiles.end());
        foundFiles.erase(std::unique(foundFiles.begin(), foundFiles.end()),
                         foundFiles.end());
        this->Makefile->GetCMakeInstance()->AddGlobCacheEntry(
          recurse, (recurse ? g.GetRecurseListDirs() : g.GetListDirs()),
          (recurse ? g.GetRecurseThroughSymlinks() : false),
          (g.GetRelative() ? g.GetRelative() : ""), expr, foundFiles, variable,
          this->Makefile->GetBacktrace());
      } else {
        warnConfigureLate = true;
      }
      ++i;
    }
  }

  switch (status) {
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Correct behavior, yay!
      break;
    case cmPolicies::OLD:
    // Probably not really the expected behavior, but the author explicitly
    // asked for the old behavior... no warning.
    case cmPolicies::WARN:
      // Possibly unexpected old behavior *and* we actually traversed
      // symlinks without being explicitly asked to: warn the author.
      if (warnFollowedSymlinks) {
        this->Makefile->IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmPolicies::GetPolicyWarning(cmPolicies::CMP0009));
      }
      break;
  }

  std::sort(files.begin(), files.end());
  files.erase(std::unique(files.begin(), files.end()), files.end());
  this->Makefile->AddDefinition(variable, cmJoin(files, ";").c_str());
  return true;
}